

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::updateChildrenMapping
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,Mapping *parent_mapping,
          Direction direction,int start,int end,int delta_item_count,bool remove)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  QAbstractItemModel *pQVar1;
  Mapping *pMVar2;
  ulong uVar3;
  quintptr qVar4;
  iterator pos;
  iterator iVar5;
  int iVar6;
  uint uVar7;
  QList<QModelIndex> *this_01;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *pair;
  pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *ppVar8;
  long lVar9;
  long in_FS_OFFSET;
  Mapping *cm;
  Mapping *local_c0;
  QModelIndexWrapper local_b8;
  QModelIndex local_98;
  QModelIndex local_78;
  QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> *)0x0;
  local_58.size = 0;
  this_01 = &parent_mapping->mapped_children;
  pos = QList<QModelIndex>::begin(this_01);
  iVar6 = -delta_item_count;
  if (!remove) {
    iVar6 = delta_item_count;
  }
  this_00 = &(this->super_QAbstractProxyModelPrivate).model;
LAB_0041a978:
  do {
    iVar5 = QList<QModelIndex>::end(this_01);
    if (pos.i == iVar5.i) {
      ppVar8 = local_58.ptr;
      for (lVar9 = local_58.size << 5; lVar9 != 0; lVar9 = lVar9 + -0x20) {
        pMVar2 = ppVar8->second;
        (pMVar2->source_parent).m.ptr = (ppVar8->first).m.ptr;
        iVar6 = (ppVar8->first).c;
        qVar4 = (ppVar8->first).i;
        (pMVar2->source_parent).r = (ppVar8->first).r;
        (pMVar2->source_parent).c = iVar6;
        (pMVar2->source_parent).i = qVar4;
        local_78.m.ptr = (ppVar8->first).m.ptr;
        local_78.r = (ppVar8->first).r;
        local_78.c = (ppVar8->first).c;
        local_78.i = (ppVar8->first).i;
        QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*>::
        emplace<QSortFilterProxyModelPrivate::Mapping*const&>
                  ((QHash<QtPrivate::QModelIndexWrapper,QSortFilterProxyModelPrivate::Mapping*> *)
                   &this->source_index_mapping,(QModelIndexWrapper *)&local_78,&ppVar8->second);
        ppVar8 = ppVar8 + 1;
      }
      QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
      ~QArrayDataPointer(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    uVar3._0_4_ = (pos.i)->r;
    uVar3._4_4_ = (pos.i)->c;
    local_78.i = (pos.i)->i;
    local_78.m.ptr = ((pos.i)->m).ptr;
    uVar7 = uVar3._4_4_;
    if (direction == Rows) {
      uVar7 = (undefined4)uVar3;
    }
    local_78._0_8_ = uVar3;
    if (start <= (int)uVar7) {
      if ((int)uVar7 <= end && remove) {
        pos = QList<QModelIndex>::erase(this_01,pos.i);
        remove_from_mapping(this,&local_78);
        goto LAB_0041a978;
      }
      local_98.r = -1;
      local_98.c = -1;
      local_98.i = 0;
      local_98.m.ptr = (QAbstractItemModel *)0x0;
      if (direction == Rows) {
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar1,(ulong)(uVar7 + iVar6),(ulong)(uint)uVar3._4_4_,source_parent);
      }
      else {
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar1,uVar3 & 0xffffffff,(ulong)(uVar7 + iVar6),source_parent);
      }
      local_98.m.ptr = local_b8.index.m.ptr;
      local_98.r = local_b8.index.r;
      local_98.c = local_b8.index.c;
      local_98.i = local_b8.index.i;
      ((pos.i)->m).ptr = local_b8.index.m.ptr;
      (pos.i)->r = local_b8.index.r;
      (pos.i)->c = local_b8.index.c;
      (pos.i)->i = local_b8.index.i;
      local_b8.index.m.ptr = local_78.m.ptr;
      local_b8.index.r = local_78.r;
      local_b8.index.c = local_78.c;
      local_b8.index.i = local_78.i;
      local_c0 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
                 takeImpl<QtPrivate::QModelIndexWrapper>(&this->source_index_mapping,&local_b8);
      QList<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
      emplaceBack<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
                ((QList<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>> *)&local_58,
                 &local_98,&local_c0);
    }
    pos.i = pos.i + 1;
  } while( true );
}

Assistant:

void QSortFilterProxyModelPrivate::updateChildrenMapping(const QModelIndex &source_parent, Mapping *parent_mapping,
                                                         Direction direction, int start, int end, int delta_item_count, bool remove)
{
    // see if any mapped children should be (re)moved
    QList<std::pair<QModelIndex, Mapping *>> moved_source_index_mappings;
    auto it2 = parent_mapping->mapped_children.begin();
    for ( ; it2 != parent_mapping->mapped_children.end();) {
        const QModelIndex source_child_index = *it2;
        const int pos = (direction == Direction::Rows)
                        ? source_child_index.row()
                        : source_child_index.column();
        if (pos < start) {
            // not affected
            ++it2;
        } else if (remove && pos <= end) {
            // in the removed interval
            it2 = parent_mapping->mapped_children.erase(it2);
            remove_from_mapping(source_child_index);
        } else {
            // below the removed items -- recompute the index
            QModelIndex new_index;
            const int newpos = remove ? pos - delta_item_count : pos + delta_item_count;
            if (direction == Direction::Rows) {
                new_index = model->index(newpos,
                                         source_child_index.column(),
                                         source_parent);
            } else {
                new_index = model->index(source_child_index.row(),
                                         newpos,
                                         source_parent);
            }
            *it2 = new_index;
            ++it2;

            // update mapping
            Mapping *cm = source_index_mapping.take(source_child_index);
            Q_ASSERT(cm);
            // we do not reinsert right away, because the new index might be identical with another, old index
            moved_source_index_mappings.emplace_back(new_index, cm);
        }
    }

    // reinsert moved, mapped indexes
    for (auto &pair : std::as_const(moved_source_index_mappings)) {
        pair.second->source_parent = pair.first;
        source_index_mapping.insert(pair.first, pair.second);
    }
}